

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13InvalidDNnameConstraintsTest15<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
TestBody(Section13InvalidDNnameConstraintsTest15<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
         *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.13.15";
  local_88.should_validate = false;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<4ul,3ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005a7a60,(char *(*) [4])&PTR_anon_var_dwarf_28895f_005a7b40,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13InvalidDNnameConstraintsTest15) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "nameConstraintsDN3CACert",
      "nameConstraintsDN3subCA1Cert", "InvalidDNnameConstraintsTest15EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsDN3CACRL",
                              "nameConstraintsDN3subCA1CRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.15";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}